

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O0

Table * __thiscall Table::assign(Table *__return_storage_ptr__,Table *this)

{
  int local_18;
  int local_14;
  int j;
  int i;
  Table *this_local;
  
  Table(__return_storage_ptr__);
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
      __return_storage_ptr__->table[local_14][local_18].number =
           this->table[local_14][local_18].number;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Table Table::assign() {
    Table table = Table();
    for (int i = 0; i < HEIGHT; i++){
        for (int j = 0; j < WIDTH; j++) {
            table.table[i][j] = this->table[i][j];
        }
    }
    return table;
}